

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

OrphanBuilder *
capnp::_::OrphanBuilder::initStruct
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          StructSize size)

{
  SegmentBuilder *pSVar1;
  OrphanBuilder *pOVar2;
  AllocateResult AVar3;
  
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  if (arena == (BuilderArena *)0x0) {
    pOVar2 = __return_storage_ptr__;
    if (*(int *)((long)&(__return_storage_ptr__->tag).content + 4) == 0 &&
        (int)(__return_storage_ptr__->tag).content == 0) {
      pSVar1 = (SegmentBuilder *)0x0;
    }
    else {
      pSVar1 = (SegmentBuilder *)0x0;
      WireHelpers::zeroObject((SegmentBuilder *)0x0,capTable,(WirePointer *)__return_storage_ptr__);
    }
  }
  else {
    AVar3 = BuilderArena::allocate(arena,((uint)size & 0xffff) + ((uint)size >> 0x10));
    pSVar1 = AVar3.segment;
    pOVar2 = (OrphanBuilder *)AVar3.words;
  }
  *(undefined4 *)&(__return_storage_ptr__->tag).content = 0xfffffffc;
  *(StructDataWordCount *)((long)&(__return_storage_ptr__->tag).content + 4) = size.data;
  *(StructPointerCount *)((long)&(__return_storage_ptr__->tag).content + 6) = size.pointers;
  __return_storage_ptr__->segment = pSVar1;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->location = &pOVar2->tag;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::initStruct(
    BuilderArena* arena, CapTableBuilder* capTable, StructSize size) {
  OrphanBuilder result;
  StructBuilder builder = WireHelpers::initStructPointer(
      result.tagAsPtr(), nullptr, capTable, size, arena);
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}